

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

PatternBlock * TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{
  pointer puVar1;
  uint startbit;
  PatternBlock *pPVar2;
  PatternBlock *pPVar3;
  PatternBlock *pPVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar8 = bitstart + 7;
  if (-1 < bitstart) {
    uVar8 = bitstart;
  }
  uVar8 = uVar8 & 0xfffffff8;
  uVar6 = bitend + 7;
  if (-1 < bitend) {
    uVar6 = bitend;
  }
  uVar6 = uVar6 & 0xfffffff8;
  iVar7 = bitstart % 8;
  if (uVar8 == uVar6) {
    pPVar2 = buildSingle((uVar8 - bitend % 8) + 7,(uVar8 - iVar7) + 7,(uintm)value);
    return pPVar2;
  }
  pPVar2 = buildSingle(uVar8,(uVar8 - iVar7) + 7,(uintm)value);
  lVar5 = value >> (8U - (char)iVar7 & 0x3f);
  while( true ) {
    startbit = uVar8 + 8;
    if (startbit == uVar6) break;
    pPVar3 = buildSingle(startbit,uVar8 + 0xf,(uintm)lVar5);
    pPVar4 = pPVar3;
    if (pPVar2 != (PatternBlock *)0x0) {
      pPVar4 = PatternBlock::intersect(pPVar2,pPVar3);
      puVar1 = (pPVar2->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = (pPVar2->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      operator_delete(pPVar2);
      puVar1 = (pPVar3->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = (pPVar3->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      operator_delete(pPVar3);
    }
    lVar5 = lVar5 >> 8;
    pPVar2 = pPVar4;
    uVar8 = startbit;
  }
  pPVar3 = buildSingle((uVar6 - bitend % 8) + 7,uVar6 | 7,(uintm)lVar5);
  pPVar4 = pPVar3;
  if (pPVar2 != (PatternBlock *)0x0) {
    pPVar4 = PatternBlock::intersect(pPVar2,pPVar3);
    puVar1 = (pPVar2->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (pPVar2->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    operator_delete(pPVar2);
    puVar1 = (pPVar3->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (pPVar3->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    operator_delete(pPVar3);
  }
  return pPVar4;
}

Assistant:

PatternBlock *TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{				// Build pattern block given a littleendian contiguous
				// range of bits and a value for those bits
  PatternBlock *tmpblock,*block;
  int4 startbit,endbit;

  block = (PatternBlock *)0;

  // we need to convert a bit range specified on a little endian token where the
  // bit indices label the least sig bit as 0 into a bit range on big endian bytes
  // where the indices label the most sig bit as 0.  The reversal due to
  // little->big endian cancels part of the reversal due to least->most sig bit
  // labelling, but not on the lower 3 bits.  So the transform becomes
  // leave the upper bits the same, but transform the lower 3-bit value x into 7-x.

  startbit = (bitstart/8) * 8;	// Get the high-order portion of little/LSB labelling
  endbit = (bitend/8) * 8;
  bitend = bitend % 8;		// Get the low-order portion of little/LSB labelling
  bitstart = bitstart % 8;

  if (startbit == endbit) {
    startbit += 7 - bitend;
    endbit += 7 - bitstart;
    block = buildSingle(startbit,endbit,(uintm)value);
  }
  else {
    block = buildSingle(startbit,startbit+(7-bitstart),(uintm)value);
    value >>= (8-bitstart);	// Cut off bits we just encoded
    startbit += 8;
    while(startbit != endbit) {
      tmpblock = buildSingle(startbit,startbit+7,(uintm)value);
      if (block == (PatternBlock *)0)
	block = tmpblock;
      else {
	PatternBlock *newblock = block->intersect(tmpblock);
	delete block;
	delete tmpblock;
	block = newblock;
      }
      value >>= 8;
      startbit += 8;
    }
    tmpblock = buildSingle(endbit+(7-bitend),endbit+7,(uintm)value);
    if (block == (PatternBlock *)0)
      block = tmpblock;
    else {
      PatternBlock *newblock = block->intersect(tmpblock);
      delete block;
      delete tmpblock;
      block = newblock;
    }
  }
  return block;
}